

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_validation.c
# Opt level: O1

REF_STATUS ref_validation_cell_node(REF_GRID ref_grid)

{
  REF_NODE pRVar1;
  REF_CELL ref_cell;
  bool bVar2;
  REF_STATUS RVar3;
  long lVar4;
  ulong uVar5;
  REF_INT cell;
  long lVar6;
  bool bVar7;
  REF_INT nodes [27];
  REF_INT local_a8 [30];
  
  pRVar1 = ref_grid->node;
  uVar5 = 0;
  do {
    ref_cell = ref_grid->cell[uVar5];
    if (0 < ref_cell->max) {
      cell = 0;
      do {
        RVar3 = ref_cell_nodes(ref_cell,cell,local_a8);
        if (RVar3 == 0) {
          if ((long)ref_cell->node_per < 1) {
LAB_001d3db8:
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
                   ,400,"ref_validation_cell_node",1,"cell with all ghost nodes");
            return 1;
          }
          lVar4 = 0;
          bVar7 = false;
          do {
            lVar6 = (long)local_a8[lVar4];
            if (((lVar6 < 0) || (ref_grid->node->max <= local_a8[lVar4])) ||
               (ref_grid->node->global[lVar6] < 0)) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
                     ,0x18a,"ref_validation_cell_node",1,"cell with invalid node");
              printf("group %d node_per %d\n",uVar5 & 0xffffffff,(ulong)(uint)ref_cell->node_per);
              return 1;
            }
            bVar2 = !bVar7;
            bVar7 = true;
            if (bVar2) {
              bVar7 = ref_grid->mpi->id == pRVar1->part[lVar6];
            }
            lVar4 = lVar4 + 1;
          } while (ref_cell->node_per != lVar4);
          if (!bVar7) goto LAB_001d3db8;
        }
        cell = cell + 1;
      } while (cell < ref_cell->max);
    }
    uVar5 = uVar5 + 1;
    if (uVar5 == 0x10) {
      return 0;
    }
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_validation_cell_node(REF_GRID ref_grid) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_INT group;
  REF_INT cell, node, nodes[REF_CELL_MAX_SIZE_PER];
  REF_BOOL has_local;

  each_ref_grid_all_ref_cell(ref_grid, group, ref_cell) {
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      has_local = REF_FALSE;
      for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
        if (!ref_node_valid(ref_grid_node(ref_grid), nodes[node])) {
          RSB(REF_FAILURE, "cell with invalid node", {
            printf("group %d node_per %d\n", group,
                   ref_cell_node_per(ref_cell));
          });
        }
        has_local = has_local || (ref_mpi_rank(ref_grid_mpi(ref_grid)) ==
                                  ref_node_part(ref_node, nodes[node]));
      }
      if (!has_local) {
        RSS(REF_FAILURE, "cell with all ghost nodes");
      }
    }
  }

  return REF_SUCCESS;
}